

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::storage<baryonyx::itm::default_cost_type<long_double>,_baryonyx::itm::maximize_tag>::
crossover(storage<baryonyx::itm::default_cost_type<long_double>,_baryonyx::itm::maximize_tag> *this,
         local_context *ctx,bit_array *x,bit_array *first,bit_array *second)

{
  int iVar1;
  underlying_type uVar2;
  underlying_type uVar3;
  result_type_conflict rVar4;
  underlying_type x2;
  underlying_type x1;
  int i;
  int block_size;
  bit_array *second_local;
  bit_array *first_local;
  bit_array *x_local;
  local_context *ctx_local;
  storage<baryonyx::itm::default_cost_type<long_double>,_baryonyx::itm::maximize_tag> *this_local;
  
  iVar1 = bit_array_impl::block_size(&x->super_bit_array_impl);
  for (x1._0_4_ = 0; (int)x1 != iVar1; x1._0_4_ = (int)x1 + 1) {
    uVar2 = bit_array_impl::block(&first->super_bit_array_impl,(int)x1);
    uVar3 = bit_array_impl::block(&second->super_bit_array_impl,(int)x1);
    rVar4 = std::uniform_int_distribution<unsigned_long>::operator()(&ctx->crossover_dist,&ctx->rng)
    ;
    bit_array_impl::set_block(&x->super_bit_array_impl,(int)x1,(uVar2 ^ uVar3) & rVar4 ^ uVar2);
  }
  return;
}

Assistant:

void crossover(local_context& ctx,
                   bit_array& x,
                   const bit_array& first,
                   const bit_array& second)
    {
        const auto block_size = x.block_size();
        for (int i = 0; i != block_size; ++i) {
            const auto x1 = first.block(i);
            const auto x2 = second.block(i);

            x.set_block(i, ((x1 ^ x2) & ctx.crossover_dist(ctx.rng)) ^ x1);
        }
    }